

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::DefaultAtomVisitor::visit(DefaultAtomVisitor *this,DirectionalAtom *datom)

{
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  AtomType *this_00;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  RealType RVar6;
  double dVar7;
  AtomInfo *this_01;
  AtomInfo *pAVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  bool bVar9;
  uint i_2;
  AtomInfo **ppAVar10;
  uint i;
  long lVar11;
  string *psVar12;
  uint j_1;
  long lVar13;
  AtomInfo **ppAVar14;
  BaseAtomVisitor *this_04;
  double (*padVar15) [3];
  string *psVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Vector<double,_3U> result_1;
  MultipoleAdapter ma;
  SquareMatrix3<double> result;
  FixedChargeAdapter fca;
  GayBerneAdapter gba;
  FluctuatingChargeAdapter fqa;
  undefined8 local_118;
  undefined8 uStack_110;
  double local_108;
  MultipoleAdapter local_100;
  AtomInfo *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  undefined1 local_e8 [64];
  BaseAtomVisitor *local_a8;
  value_type local_a0;
  FixedChargeAdapter local_90;
  GayBerneAdapter local_88;
  FluctuatingChargeAdapter local_80;
  double local_78 [9];
  
  this_00 = (datom->super_Atom).atomType_;
  bVar9 = BaseAtomVisitor::isVisited(&this->super_BaseAtomVisitor,&datom->super_Atom);
  if (bVar9) {
    return;
  }
  local_f8 = (AtomInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
            (&_Stack_f0,&local_f8,(allocator<OpenMD::AtomInfo> *)local_78);
  this_02._M_pi = _Stack_f0._M_pi;
  this_01 = local_f8;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_f8,datom);
  psVar16 = (string *)&local_f8;
  std::__cxx11::string::operator=((string *)this_01,psVar16);
  if (local_f8 != (AtomInfo *)local_e8) {
    operator_delete(local_f8,(ulong)(local_e8._0_8_ + 1));
  }
  this_01->globalID = (datom->super_Atom).super_StuntDouble.globalIndex_;
  DVar4 = (datom->super_Atom).super_StuntDouble.storage_;
  pSVar5 = ((datom->super_Atom).super_StuntDouble.snapshotMan_)->currentSnapshot_;
  lVar11 = *(long *)((long)&(pSVar5->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  lVar13 = (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 0x18;
  pdVar1 = (double *)(lVar11 + lVar13);
  dVar3 = *pdVar1;
  dVar7 = pdVar1[1];
  (this_01->pos).super_Vector<double,_3U>.data_[2] = *(double *)(lVar11 + 0x10 + lVar13);
  (this_01->pos).super_Vector<double,_3U>.data_[0] = dVar3;
  (this_01->pos).super_Vector<double,_3U>.data_[1] = dVar7;
  lVar11 = *(long *)((long)&(pSVar5->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  pdVar1 = (double *)(lVar11 + lVar13);
  dVar3 = *pdVar1;
  dVar7 = pdVar1[1];
  (this_01->vel).super_Vector<double,_3U>.data_[2] = *(double *)(lVar11 + 0x10 + lVar13);
  (this_01->vel).super_Vector<double,_3U>.data_[0] = dVar3;
  (this_01->vel).super_Vector<double,_3U>.data_[1] = dVar7;
  lVar11 = *(long *)((long)&(pSVar5->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  pdVar1 = (double *)(lVar11 + lVar13);
  dVar3 = *pdVar1;
  dVar7 = pdVar1[1];
  (this_01->frc).super_Vector<double,_3U>.data_[2] = *(double *)(lVar11 + 0x10 + lVar13);
  (this_01->frc).super_Vector<double,_3U>.data_[0] = dVar3;
  (this_01->frc).super_Vector<double,_3U>.data_[1] = dVar7;
  this_01->hasVelocity = true;
  this_01->hasForce = true;
  this_01->hasGlobalID = true;
  local_90.at_ = this_00;
  bVar9 = FixedChargeAdapter::isFixedCharge(&local_90);
  if (bVar9) {
    this_01->hasCharge = true;
    RVar6 = FixedChargeAdapter::getCharge(&local_90);
    this_01->charge = RVar6;
  }
  local_80.at_ = this_00;
  bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_80);
  if (bVar9) {
    this_01->hasCharge = true;
    this_01->charge =
         *(double *)
          (*(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->currentSnapshot_
                            ->atomData).flucQPos.super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (datom->super_Atom).super_StuntDouble.storage_) +
          (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 8) + this_01->charge;
  }
  if ((((this->super_BaseAtomVisitor).storageLayout_ & 0x1000) != 0) &&
     (bVar9 = AtomType::isElectrostatic(this_00), bVar9)) {
    this_01->hasElectricField = true;
    lVar13 = (long)(datom->super_Atom).super_StuntDouble.localIndex_;
    lVar11 = *(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->
                               currentSnapshot_->atomData).electricField.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (datom->super_Atom).super_StuntDouble.storage_);
    pdVar1 = (double *)(lVar11 + lVar13 * 0x18);
    dVar3 = *pdVar1;
    dVar7 = pdVar1[1];
    (this_01->eField).super_Vector<double,_3U>.data_[2] = *(double *)(lVar11 + 0x10 + lVar13 * 0x18)
    ;
    (this_01->eField).super_Vector<double,_3U>.data_[0] = dVar3;
    (this_01->eField).super_Vector<double,_3U>.data_[1] = dVar7;
  }
  local_100.at_ = this_00;
  local_88.at_ = this_00;
  bVar9 = GayBerneAdapter::isGayBerne(&local_88);
  if (bVar9) {
    this_01->hasVector = true;
    padVar15 = (double (*) [3])local_78;
    StuntDouble::getA((RotMat3x3d *)padVar15,(StuntDouble *)datom);
    ppAVar10 = &local_f8;
    local_e8._32_8_ = 0;
    local_e8._40_8_ = 0.0;
    local_e8._16_8_ = 0;
    local_e8._24_8_ = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    local_f8 = (AtomInfo *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e8._48_8_ = 0.0;
    lVar11 = 0;
    do {
      lVar13 = 0;
      ppAVar14 = ppAVar10;
      do {
        *ppAVar14 = (AtomInfo *)
                    (((SquareMatrix<double,_3> *)*padVar15)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar13];
        lVar13 = lVar13 + 1;
        ppAVar14 = ppAVar14 + 3;
      } while (lVar13 != 3);
      lVar11 = lVar11 + 1;
      ppAVar10 = ppAVar10 + 1;
      padVar15 = padVar15 + 1;
    } while (lVar11 != 3);
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0.0;
    ppAVar10 = &local_f8;
    lVar11 = 0;
    do {
      dVar3 = (double)(&local_118)[lVar11];
      lVar13 = 0;
      do {
        dVar3 = dVar3 + *(double *)((long)ppAVar10 + lVar13) *
                        *(double *)((long)&OpenMD::V3Z + lVar13);
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x18);
      (&local_118)[lVar11] = dVar3;
      lVar11 = lVar11 + 1;
      ppAVar10 = ppAVar10 + 3;
    } while (lVar11 != 3);
LAB_0021860c:
    (this_01->vec).super_Vector<double,_3U>.data_[2] = local_108;
    uVar17 = (undefined4)local_118;
    uVar18 = local_118._4_4_;
    uVar19 = (undefined4)uStack_110;
    uVar20 = uStack_110._4_4_;
  }
  else {
    bVar9 = MultipoleAdapter::isDipole(&local_100);
    if (!bVar9) {
      bVar9 = MultipoleAdapter::isQuadrupole(&local_100);
      if (!bVar9) goto LAB_00218669;
      this_01->hasVector = true;
      padVar15 = (double (*) [3])local_78;
      StuntDouble::getA((RotMat3x3d *)padVar15,(StuntDouble *)datom);
      local_e8._32_8_ = 0;
      local_e8._40_8_ = 0.0;
      local_e8._16_8_ = 0;
      local_e8._24_8_ = 0;
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = 0;
      local_f8 = (AtomInfo *)0x0;
      _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8._48_8_ = 0.0;
      lVar11 = 0;
      do {
        lVar13 = 0;
        psVar12 = psVar16;
        do {
          *(double *)psVar12 =
               (((SquareMatrix<double,_3> *)*padVar15)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar13];
          lVar13 = lVar13 + 1;
          psVar12 = psVar12 + 0x18;
        } while (lVar13 != 3);
        lVar11 = lVar11 + 1;
        psVar16 = psVar16 + 8;
        padVar15 = padVar15 + 1;
      } while (lVar11 != 3);
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0.0;
      ppAVar10 = &local_f8;
      lVar11 = 0;
      do {
        dVar3 = (double)(&local_118)[lVar11];
        lVar13 = 0;
        do {
          dVar3 = dVar3 + *(double *)((long)ppAVar10 + lVar13) *
                          *(double *)((long)&OpenMD::V3Z + lVar13);
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x18);
        (&local_118)[lVar11] = dVar3;
        lVar11 = lVar11 + 1;
        ppAVar10 = ppAVar10 + 3;
      } while (lVar11 != 3);
      goto LAB_0021860c;
    }
    this_01->hasVector = true;
    lVar13 = (long)(datom->super_Atom).super_StuntDouble.localIndex_;
    lVar11 = *(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->
                               currentSnapshot_->atomData).dipole.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (datom->super_Atom).super_StuntDouble.storage_);
    puVar2 = (undefined4 *)(lVar11 + lVar13 * 0x18);
    uVar17 = *puVar2;
    uVar18 = puVar2[1];
    uVar19 = puVar2[2];
    uVar20 = puVar2[3];
    (this_01->vec).super_Vector<double,_3U>.data_[2] = *(double *)(lVar11 + 0x10 + lVar13 * 0x18);
  }
  *(undefined4 *)(this_01->vec).super_Vector<double,_3U>.data_ = uVar17;
  *(undefined4 *)((long)(this_01->vec).super_Vector<double,_3U>.data_ + 4) = uVar18;
  *(undefined4 *)((this_01->vec).super_Vector<double,_3U>.data_ + 1) = uVar19;
  *(undefined4 *)((long)(this_01->vec).super_Vector<double,_3U>.data_ + 0xc) = uVar20;
LAB_00218669:
  local_f8 = (AtomInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
            (&_Stack_f0,(AtomData **)&local_f8,(allocator<OpenMD::AtomData> *)local_78);
  this_03._M_pi = _Stack_f0._M_pi;
  pAVar8 = local_f8;
  local_f8 = (AtomInfo *)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ATOMDATA","");
  std::__cxx11::string::_M_assign((string *)&(pAVar8->atomTypeName)._M_string_length);
  if (local_f8 != (AtomInfo *)local_e8) {
    operator_delete(local_f8,(ulong)(local_e8._0_8_ + 1));
  }
  local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_02._M_pi;
  if ((BaseAtomVisitor *)this_02._M_pi != (BaseAtomVisitor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)&(this_02._M_pi)->_M_use_count)->_M_dataplus)._M_p =
           *(int *)&(((string *)&(this_02._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)&(this_02._M_pi)->_M_use_count)->_M_dataplus)._M_p =
           *(int *)&(((string *)&(this_02._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
    }
  }
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
             *)&pAVar8->pos,&local_a0);
  if ((BaseAtomVisitor *)
      local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (BaseAtomVisitor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_e8._56_8_ = pAVar8;
  local_a8 = (BaseAtomVisitor *)this_03._M_pi;
  if ((BaseAtomVisitor *)this_03._M_pi != (BaseAtomVisitor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)&(this_03._M_pi)->_M_use_count)->_M_dataplus)._M_p =
           *(int *)&(((string *)&(this_03._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)&(this_03._M_pi)->_M_use_count)->_M_dataplus)._M_p =
           *(int *)&(((string *)&(this_03._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
    }
  }
  StuntDouble::addProperty
            ((StuntDouble *)datom,(shared_ptr<OpenMD::GenericData> *)(local_e8 + 0x38));
  this_04 = local_a8;
  if (local_a8 != (BaseAtomVisitor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8);
  }
  BaseAtomVisitor::setVisited(this_04,&datom->super_Atom);
  if ((BaseAtomVisitor *)this_02._M_pi != (BaseAtomVisitor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  if ((BaseAtomVisitor *)this_03._M_pi != (BaseAtomVisitor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
  }
  return;
}

Assistant:

void DefaultAtomVisitor::visit(DirectionalAtom* datom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    AtomType* atype = datom->getAtomType();

    if (isVisited(datom)) return;

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = datom->getType();
    atomInfo->globalID     = datom->getGlobalIndex();
    atomInfo->pos          = datom->getPos();
    atomInfo->vel          = datom->getVel();
    atomInfo->frc          = datom->getFrc();
    atomInfo->hasVelocity  = true;
    atomInfo->hasForce     = true;
    atomInfo->hasGlobalID  = true;

    FixedChargeAdapter fca = FixedChargeAdapter(atype);
    if (fca.isFixedCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge    = fca.getCharge();
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
    if (fqa.isFluctuatingCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge += datom->getFlucQPos();
    }

    if ((storageLayout_ & DataStorage::dslElectricField) &&
        (atype->isElectrostatic())) {
      atomInfo->hasElectricField = true;
      atomInfo->eField           = datom->getElectricField();
    }

    GayBerneAdapter gba = GayBerneAdapter(atype);
    MultipoleAdapter ma = MultipoleAdapter(atype);

    if (gba.isGayBerne()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    } else if (ma.isDipole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getDipole();
    } else if (ma.isQuadrupole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    }

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    datom->addProperty(atomData);

    setVisited(datom);
  }